

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double find_split_std_gain_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                 (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 GainCriterion criterion,double min_gain,double *split_point,size_t *split_ix,
                 vector<double,_std::allocator<double>_> *w)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  unkuint10 Var4;
  reference pvVar5;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  float in_XMM0_Da;
  double dVar9;
  double in_XMM1_Qa;
  double *in_stack_00000008;
  ulong *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  size_t row;
  double w_this;
  double this_gain;
  double this_sd;
  longdouble currw;
  double best_gain;
  longdouble mean_prev;
  longdouble running_ssq;
  longdouble running_mean;
  double full_sd;
  longdouble cumw;
  longdouble in_stack_fffffffffffffeb8;
  longdouble local_138;
  longdouble local_12c;
  ulong local_d8;
  undefined8 local_b8;
  undefined2 in_stack_ffffffffffffff50;
  undefined2 uVar10;
  undefined6 in_stack_ffffffffffffff52;
  double *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  double dVar11;
  size_t in_stack_ffffffffffffff68;
  undefined8 uVar12;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined6 in_stack_ffffffffffffff72;
  undefined4 local_88;
  float in_stack_ffffffffffffff7c;
  undefined4 uVar15;
  undefined2 in_stack_ffffffffffffff80;
  undefined2 uVar16;
  undefined6 in_stack_ffffffffffffff82;
  undefined8 local_78;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 uVar17;
  undefined6 in_stack_ffffffffffffff92;
  longdouble local_58;
  double local_40;
  int local_34;
  long local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  float local_c;
  long local_8;
  
  Var4 = (unkuint10)in_stack_fffffffffffffeb8 >> 0x40;
  in_stack_fffffffffffffeb8 = (longdouble)CONCAT28((short)Var4,&local_58);
  local_40 = in_XMM1_Qa;
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  calc_sd_right_to_left_weighted<float,std::vector<double,std::allocator<double>>,long_double>
            ((float *)CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,
             (size_t *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (vector<double,_std::allocator<double>_> *)
             CONCAT62(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50),
             (longdouble *)CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90));
  dVar9 = (double)in_ST0;
  lVar6 = (longdouble)0;
  local_78 = SUB108(lVar6,0);
  uVar10 = (undefined2)((unkuint10)lVar6 >> 0x40);
  local_88 = SUB104(lVar6,0);
  uVar15 = (undefined4)((unkuint10)lVar6 >> 0x20);
  lVar6 = (longdouble)(*(float *)(local_8 + *(long *)(local_18 + local_20 * 8) * 4) - local_c);
  uVar12 = SUB108(lVar6,0);
  dVar11 = -INFINITY;
  *in_stack_00000010 = local_20;
  local_b8 = local_78;
  uVar13 = (short)((unkuint10)lVar6 >> 0x40);
  uVar16 = uVar10;
  uVar17 = uVar10;
  for (local_d8 = local_20; lVar6 = in_stack_fffffffffffffeb8, local_d8 < local_28;
      local_d8 = local_d8 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000018,*(size_type *)(local_18 + local_d8 * 8));
    dVar3 = *pvVar5;
    lVar7 = (longdouble)CONCAT28(uVar10,local_b8) + (longdouble)dVar3;
    local_b8 = SUB108(lVar7,0);
    uVar10 = (undefined2)((unkuint10)lVar7 >> 0x40);
    lVar8 = ((longdouble)dVar3 *
            ((longdouble)(*(float *)(local_8 + *(long *)(local_18 + local_d8 * 8) * 4) - local_c) -
            (longdouble)CONCAT28(uVar17,local_78))) / lVar7 + (longdouble)CONCAT28(uVar17,local_78);
    local_78 = SUB108(lVar8,0);
    uVar14 = (undefined2)((unkuint10)lVar8 >> 0x40);
    lVar6 = (longdouble)(*(float *)(local_8 + *(long *)(local_18 + local_d8 * 8) * 4) - local_c);
    lVar6 = (longdouble)dVar3 * (lVar6 - lVar8) * (lVar6 - (longdouble)CONCAT28(uVar13,uVar12)) +
            (longdouble)CONCAT28(uVar16,CONCAT44(uVar15,local_88));
    local_88 = SUB104(lVar6,0);
    uVar15 = (undefined4)((unkuint10)lVar6 >> 0x20);
    uVar16 = (undefined2)((unkuint10)lVar6 >> 0x40);
    fVar2 = *(float *)(local_8 + *(long *)(local_18 + local_d8 * 8) * 4);
    pfVar1 = (float *)(local_8 + *(long *)(local_18 + 8 + local_d8 * 8) * 4);
    uVar12 = local_78;
    uVar17 = uVar14;
    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
      if (local_d8 == local_20) {
        local_12c = (longdouble)0;
        lVar6 = in_ST1;
      }
      else {
        in_stack_fffffffffffffeb8 = lVar6 / lVar7;
        lVar7 = in_ST4;
        std::sqrt((double)(ulong)(uint)fVar2);
        lVar6 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = lVar7;
        local_12c = in_ST1;
      }
      in_ST1 = lVar6;
      if (local_34 == 2) {
        local_138 = (longdouble)1 +
                    -(longdouble)(1.0 / dVar9) *
                    ((longdouble)*(double *)(local_30 + 8 + (local_d8 - local_20) * 8) *
                     ((longdouble)(float)(local_58 - (longdouble)CONCAT28(uVar10,local_b8)) /
                     local_58) +
                    ((longdouble)(float)(longdouble)CONCAT28(uVar10,local_b8) / local_58) *
                    (longdouble)(double)local_12c);
        in_ST4 = in_ST3;
      }
      else {
        local_138 = (longdouble)
                    (1.0 - ((double)local_12c +
                           *(double *)(local_30 + 8 + (local_d8 - local_20) * 8)) / (dVar9 + dVar9))
        ;
      }
      dVar3 = (double)local_138;
      if ((dVar11 < dVar3) && (local_40 < dVar3)) {
        *in_stack_00000010 = local_d8;
        dVar11 = dVar3;
      }
    }
    uVar13 = uVar14;
  }
  if (-INFINITY < dVar11) {
    Var4 = (unkuint10)in_stack_fffffffffffffeb8 >> 0x20;
    dVar9 = midpoint<float>((float)Var4,SUB104(lVar6,0));
    *in_stack_00000008 = dVar9;
  }
  return dVar11;
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, real_t xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point, size_t &restrict split_ix, mapping &restrict w)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, xmean, ix_arr, st, end, sd_arr, w, cumw);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[ix_arr[st]] - xmean;
    double best_gain = -HUGE_VAL;
    ldouble_safe currw = 0;
    double this_sd, this_gain;
    double w_this;
    split_ix = st;

    for (size_t row = st; row < end; row++)
    {
        w_this = w[ix_arr[row]];
        currw += w_this;
        running_mean   += w_this * ((x[ix_arr[row]] - xmean) - running_mean) / currw;
        running_ssq    += w_this * (((x[ix_arr[row]] - xmean) - running_mean) * ((x[ix_arr[row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        this_sd = (row == st)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row-st+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row-st+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);

    return best_gain;
}